

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

bool __thiscall
google::
dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::
serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
          (dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  int bit;
  long lVar10;
  uchar bits;
  byte local_39;
  long local_38;
  
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar2 = sparsehash_internal::write_bigendian_number<std::__cxx11::stringstream,unsigned_long>
                    (param_2,0x13578642,4);
  if (((bVar2) &&
      (bVar2 = sparsehash_internal::write_bigendian_number<std::__cxx11::stringstream,unsigned_long>
                         (param_2,*(unsigned_long *)(this + 0x58),8), bVar2)) &&
     (bVar2 = sparsehash_internal::write_bigendian_number<std::__cxx11::stringstream,unsigned_long>
                        (param_2,*(unsigned_long *)(this + 0x50),8), bVar2)) {
    uVar3 = *(ulong *)(this + 0x58);
    bVar2 = true;
    if (uVar3 != 0) {
      pbVar9 = param_2 + 0x10;
      if (param_2 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      local_38 = 0;
      uVar8 = 0;
      do {
        local_39 = 0;
        iVar6 = *(int *)(this + 0x38);
        lVar5 = 0;
        bVar7 = 0;
        do {
          if (lVar5 + uVar8 < uVar3) {
            iVar6 = iVar6 + 1;
            iVar1 = *(int *)(*(long *)(this + 0x70) + local_38 + lVar5 * 8);
            *(int *)(this + 0x38) = iVar6;
            if (*(int *)(this + 0x40) != iVar1) {
              local_39 = bVar7 | (byte)(1 << ((byte)lVar5 & 0x1f));
              bVar7 = local_39;
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 8);
        plVar4 = (long *)std::ostream::write((char *)pbVar9,(long)&local_39);
        if (*(int *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) != 0) goto LAB_009aee6b;
        lVar10 = 0;
        lVar5 = local_38;
        do {
          if (((local_39 >> ((uint)lVar10 & 0x1f) & 1) != 0) &&
             (plVar4 = (long *)std::ostream::write((char *)pbVar9,*(long *)(this + 0x70) + lVar5),
             *(int *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) != 0)) goto LAB_009aee6b;
          lVar10 = lVar10 + 1;
          lVar5 = lVar5 + 8;
        } while (lVar10 != 8);
        uVar8 = uVar8 + 8;
        uVar3 = *(ulong *)(this + 0x58);
        local_38 = local_38 + 0x40;
      } while (uVar8 < uVar3);
    }
  }
  else {
LAB_009aee6b:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }